

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button_symbol(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_symbol_type symbol,
                       nk_button_behavior behavior,nk_style_button *style,nk_input *in,
                       nk_user_font *font)

{
  undefined1 local_5c [8];
  nk_rect content;
  int ret;
  nk_input *in_local;
  nk_style_button *style_local;
  nk_button_behavior behavior_local;
  nk_symbol_type symbol_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  nk_rect bounds_local;
  
  bounds_local._0_8_ = bounds._8_8_;
  register0x00001200 = bounds._0_8_;
  unique0x10000203 = in;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4cd4,
                  "int nk_do_button_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4cd5,
                  "int nk_do_button_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4cd6,
                  "int nk_do_button_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out != (nk_command_buffer *)0x0) {
    if ((((out == (nk_command_buffer *)0x0) || (style == (nk_style_button *)0x0)) ||
        (font == (nk_user_font *)0x0)) || (state == (nk_flags *)0x0)) {
      bounds_local.w = 0.0;
    }
    else {
      content.w = (float)nk_do_button(state,out,bounds,style,in,behavior,(nk_rect *)local_5c);
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      nk_draw_button_symbol
                (out,(nk_rect *)((long)&state_local + 4),(nk_rect *)local_5c,*state,style,symbol,
                 font);
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
      bounds_local.w = content.w;
    }
    return (int)bounds_local.w;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x4cd7,
                "int nk_do_button_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB int
nk_do_button_symbol(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    enum nk_symbol_type symbol, enum nk_button_behavior behavior,
    const struct nk_style_button *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int ret;
    struct nk_rect content;

    NK_ASSERT(state);
    NK_ASSERT(style);
    NK_ASSERT(font);
    NK_ASSERT(out);
    if (!out || !style || !font || !state)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_symbol(out, &bounds, &content, *state, style, symbol, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}